

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall Catch::TestCaseTracking::TrackerBase::close(TrackerBase *this,int __fd)

{
  CycleState *value;
  TrackerBase *pTVar1;
  _Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::__0> *p_Var2;
  TrackerContext *pTVar3;
  bool bVar4;
  ReusableStringStream *pRVar5;
  long lVar6;
  undefined4 in_register_00000034;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  __it;
  _Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::__0> *p_Var7;
  long lVar8;
  _Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::__0> *this_00;
  ReusableStringStream local_70;
  string local_60;
  SourceLineInfo local_40;
  
  __it._M_current =
       (unique_ptr<Catch::TestCaseTracking::ITracker> *)CONCAT44(in_register_00000034,__fd);
  while (pTVar1 = (TrackerBase *)this->m_ctx->m_currentTracker, pTVar1 != this) {
    (*(pTVar1->super_ITracker)._vptr_ITracker[3])();
  }
  value = &(this->super_ITracker).m_runState;
  switch((this->super_ITracker).m_runState) {
  case NotStarted:
  case CompletedSuccessfully:
  case Failed:
    ReusableStringStream::ReusableStringStream(&local_70);
    local_40.file =
         "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
    ;
    local_40.line = 0x18fc;
    Catch::operator<<(local_70.m_oss,&local_40);
    std::operator<<(local_70.m_oss,": Internal Catch2 error: ");
    std::operator<<(local_70.m_oss,"Illogical state: ");
    pRVar5 = ReusableStringStream::operator<<(&local_70,value);
    ReusableStringStream::str_abi_cxx11_(&local_60,pRVar5);
    throw_logic_error(&local_60);
  case Executing:
    goto switchD_00158ca2_caseD_1;
  case ExecutingChildren:
    this_00 = (_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::__0> *)
              (this->super_ITracker).m_children.
              super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    p_Var2 = (_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::__0> *)
             (this->super_ITracker).m_children.
             super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar8 = (long)p_Var2 - (long)this_00;
    for (lVar6 = lVar8 >> 5; p_Var7 = this_00, 0 < lVar6; lVar6 = lVar6 + -1) {
      bVar4 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
              operator()(this_00,__it);
      if (bVar4) goto LAB_00158d3e;
      bVar4 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
              operator()(this_00 + 8,__it);
      p_Var7 = this_00 + 8;
      if (bVar4) goto LAB_00158d3e;
      bVar4 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
              operator()(this_00 + 0x10,__it);
      p_Var7 = this_00 + 0x10;
      if (bVar4) goto LAB_00158d3e;
      bVar4 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
              operator()(this_00 + 0x18,__it);
      p_Var7 = this_00 + 0x18;
      if (bVar4) goto LAB_00158d3e;
      this_00 = this_00 + 0x20;
      lVar8 = lVar8 + -0x20;
    }
    lVar8 = lVar8 >> 3;
    if (lVar8 == 1) {
LAB_00158d87:
      bVar4 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
              operator()(this_00,__it);
      p_Var7 = this_00;
      if (!bVar4) {
        p_Var7 = p_Var2;
      }
    }
    else if (lVar8 == 2) {
LAB_00158d71:
      bVar4 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
              operator()(this_00,__it);
      p_Var7 = this_00;
      if (!bVar4) {
        this_00 = this_00 + 8;
        goto LAB_00158d87;
      }
    }
    else {
      if (lVar8 != 3) goto switchD_00158ca2_caseD_1;
      bVar4 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
              operator()(this_00,__it);
      if (!bVar4) {
        this_00 = this_00 + 8;
        goto LAB_00158d71;
      }
    }
LAB_00158d3e:
    if (p_Var7 != p_Var2) goto switchD_00158ca2_caseD_3;
switchD_00158ca2_caseD_1:
    *value = CompletedSuccessfully;
switchD_00158ca2_caseD_3:
    moveToParent(this);
    pTVar3 = this->m_ctx;
    pTVar3->m_runState = CompletedCycle;
    return (int)pTVar3;
  case NeedsAnotherRun:
    goto switchD_00158ca2_caseD_3;
  default:
    ReusableStringStream::ReusableStringStream(&local_70);
    local_40.file =
         "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
    ;
    local_40.line = 0x18ff;
    Catch::operator<<(local_70.m_oss,&local_40);
    std::operator<<(local_70.m_oss,": Internal Catch2 error: ");
    std::operator<<(local_70.m_oss,"Unknown state: ");
    pRVar5 = ReusableStringStream::operator<<(&local_70,value);
    ReusableStringStream::str_abi_cxx11_(&local_60,pRVar5);
    throw_logic_error(&local_60);
  }
}

Assistant:

void TrackerBase::close() {

        // Close any still open children (e.g. generators)
        while( &m_ctx.currentTracker() != this )
            m_ctx.currentTracker().close();

        switch( m_runState ) {
            case NeedsAnotherRun:
                break;

            case Executing:
                m_runState = CompletedSuccessfully;
                break;
            case ExecutingChildren:
                if( std::all_of(m_children.begin(), m_children.end(), [](ITrackerPtr const& t){ return t->isComplete(); }) )
                    m_runState = CompletedSuccessfully;
                break;

            case NotStarted:
            case CompletedSuccessfully:
            case Failed:
                CATCH_INTERNAL_ERROR( "Illogical state: " << m_runState );

            default:
                CATCH_INTERNAL_ERROR( "Unknown state: " << m_runState );
        }
        moveToParent();
        m_ctx.completeCycle();
    }